

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O1

void sym_declare(int pass,char *id,char *filename,int line,int column)

{
  sym_t *psVar1;
  int iVar2;
  section_t *psVar3;
  sym_s *psVar4;
  size_t sVar5;
  char *pcVar6;
  sym_t **ppsVar7;
  
  if (pass != 2) {
    psVar3 = get_current_section();
    psVar4 = root;
    if (psVar3 == (section_t *)0x0) {
      err(F,"symbol declaration before a section has been created");
      return;
    }
    for (; psVar4 != (sym_t *)0x0; psVar4 = psVar4->next) {
      iVar2 = strcmp(psVar4->id,id);
      if (iVar2 == 0) {
        sym_declare_cold_1();
        return;
      }
    }
    psVar4 = (sym_s *)mmalloc(0x48);
    ppsVar7 = &cur->next;
    if (root == (sym_t *)0x0) {
      ppsVar7 = &root;
    }
    *ppsVar7 = psVar4;
    cur = psVar4;
    sVar5 = strlen(filename);
    pcVar6 = (char *)mmalloc(sVar5 + 1);
    psVar1 = cur;
    cur->filename = pcVar6;
    iVar2 = num_syms;
    psVar1->sym_id = num_syms;
    strcpy(psVar1->id,id);
    psVar1->section_id = psVar3->id;
    psVar1->offset = psVar3->pc;
    psVar1->type = none;
    strcpy(psVar1->filename,filename);
    psVar1->line = line;
    psVar1->column = column;
    psVar1->next = (sym_s *)0x0;
    num_syms = iVar2 + 1;
  }
  return;
}

Assistant:

void sym_declare(int pass, char* id, char* filename, int line, int column)
{
    section_t* sect;
    sym_t* psym;
    sym_t* new;

    if (pass == GEN_PASS)
        return;

    sect = get_current_section();
    if (sect == NULL)
    {
        err(F, "symbol declaration before a section has been created");
        return;
    }

    psym = root;
    while (psym)
    {
        if (strcmp(psym->id, id) == 0)
        {
            err(E, "redefinition of '%s'", id);
            fprintf(stderr,
                "%s:%d:%d: %sprevious definition of '%s' was here\n",
                psym->filename, psym->line, psym->column, notestr, id
                );
            return;
        }
        psym = psym->next;
    }

    new = (sym_t*)mmalloc(sizeof(sym_t));

    if (root == NULL)
    {
        root = new;
        cur = root;
    }
    else
    {
        cur->next = new;
        cur = new;
    }

    cur->filename = (char*)mmalloc(strlen(filename) + 1);

    cur->sym_id = num_syms;
    strcpy(cur->id, id);
    cur->section_id = sect->id;
    cur->offset = sect->pc;
    cur->type = 0;
    strcpy(cur->filename, filename);
    cur->line = line;
    cur->column = column;
    cur->next = NULL;

    ++num_syms;
}